

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIndexingTests.cpp
# Opt level: O0

ShaderEvalFunc deqp::getVectorSubscriptEvalFunc(DataType dataType)

{
  code *pcStack_10;
  DataType dataType_local;
  
  if (dataType == TYPE_FLOAT_VEC2) {
    pcStack_10 = evalSubscriptVec2;
  }
  else if (dataType == TYPE_FLOAT_VEC3) {
    pcStack_10 = evalSubscriptVec3;
  }
  else if (dataType == TYPE_FLOAT_VEC4) {
    pcStack_10 = evalSubscriptVec4;
  }
  else {
    pcStack_10 = (ShaderEvalFunc)0x0;
  }
  return pcStack_10;
}

Assistant:

static ShaderEvalFunc getVectorSubscriptEvalFunc(DataType dataType)
{
	if (dataType == TYPE_FLOAT_VEC2)
		return evalSubscriptVec2;
	else if (dataType == TYPE_FLOAT_VEC3)
		return evalSubscriptVec3;
	else if (dataType == TYPE_FLOAT_VEC4)
		return evalSubscriptVec4;

	DE_ASSERT(DE_FALSE && "Invalid data type.");
	return NULL;
}